

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

int gotcha_strcmp(char *in_one,char *in_two)

{
  char cVar1;
  char cVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    cVar1 = in_one[lVar3];
    cVar2 = in_two[lVar3];
    if (cVar1 == '\0') {
      return (uint)(cVar2 != '\0');
    }
    lVar3 = lVar3 + 1;
  } while (cVar1 == cVar2);
  return (int)cVar1 - (int)cVar2;
}

Assistant:

int gotcha_strcmp(const char *in_one, const char *in_two)
{
  int i = 0;
  for (;; i++) {
    if (in_one[i] == '\0') {
      return (in_two[i] == '\0') ? 0 : 1;
    }
    if (in_one[i] != in_two[i]) {
      return in_one[i] - in_two[i];
    }
  }
}